

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-stroke-builder.cpp
# Opt level: O0

void __thiscall
gepard::StrokePathBuilder::StrokePathBuilder
          (StrokePathBuilder *this,Float width,Float miterLimit,LineJoinType joinMode,
          LineCapType lineCap)

{
  StrokePathBuilder *local_40;
  LineCapType lineCap_local;
  LineJoinType joinMode_local;
  Float miterLimit_local;
  Float width_local;
  StrokePathBuilder *this_local;
  
  local_40 = this;
  do {
    LineAttributes::LineAttributes(local_40->_lines);
    local_40 = (StrokePathBuilder *)(local_40->_lines + 1);
  } while (local_40 != (StrokePathBuilder *)&this->_shapeFirstLine);
  this->_hasShapeFirstLine = false;
  this->_halfWidth = width * 0.5;
  this->_miterLimitSquared = miterLimit * miterLimit;
  this->_joinMode = joinMode;
  this->_lineCap = lineCap;
  PathData::PathData(&this->_path);
  SegmentApproximator::SegmentApproximator(&this->_segmentApproximator,0x10,1.0);
  this->_shapeFirstLine = this->_lines;
  this->_lastLine = this->_lines + 1;
  this->_currentLine = this->_lines + 2;
  this->_lastLine->next = this->_currentLine;
  this->_currentLine->next = this->_lastLine;
  return;
}

Assistant:

StrokePathBuilder::StrokePathBuilder(const Float width, const Float miterLimit, const LineJoinType joinMode, const LineCapType lineCap)
    : _hasShapeFirstLine(false)
    , _halfWidth(width / 2.0)
    , _miterLimitSquared(miterLimit * miterLimit)
    , _joinMode(joinMode)
    , _lineCap(lineCap)
{
    _shapeFirstLine = &_lines[0];
    _lastLine = &_lines[1];
    _currentLine = &_lines[2];
    _lastLine->next = _currentLine;
    _currentLine->next = _lastLine;
}